

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

void __thiscall
nv::DirectDrawSurface::mipmap(DirectDrawSurface *this,Image *img,uint face,uint mipmap)

{
  Stream *pSVar1;
  uint uVar2;
  uint *puVar3;
  uint local_3c [3];
  uint local_30;
  uint local_2c;
  uint local_28;
  uint m;
  uint h;
  uint w;
  uint mipmap_local;
  uint face_local;
  Image *img_local;
  DirectDrawSurface *this_local;
  
  pSVar1 = this->stream;
  h = mipmap;
  w = face;
  _mipmap_local = img;
  img_local = (Image *)this;
  uVar2 = offset(this,face,mipmap);
  (*pSVar1->_vptr_Stream[3])(pSVar1,(ulong)uVar2);
  m = width(this);
  local_28 = height(this);
  for (local_2c = 0; local_2c < h; local_2c = local_2c + 1) {
    local_30 = 1;
    local_3c[2] = m >> 1;
    puVar3 = max<unsigned_int>(&local_30,local_3c + 2);
    m = *puVar3;
    local_3c[1] = 1;
    local_3c[0] = local_28 >> 1;
    puVar3 = max<unsigned_int>(local_3c + 1,local_3c);
    local_28 = *puVar3;
  }
  Image::allocate(_mipmap_local,m,local_28);
  if (((this->header).pf.flags & 0x40) == 0) {
    if (((this->header).pf.flags & 4) != 0) {
      readBlockImage(this,_mipmap_local);
    }
  }
  else {
    readLinearImage(this,_mipmap_local);
  }
  return;
}

Assistant:

void DirectDrawSurface::mipmap(Image * img, uint face, uint mipmap)
{
	nvDebugCheck(isValid());
	
	stream->seek(offset(face, mipmap));
	
	uint w = width();
	uint h = height();
	
	// Compute width and height.
	for (uint m = 0; m < mipmap; m++)
	{
		w = max(1U, w / 2);
		h = max(1U, h / 2);
	}
	
	img->allocate(w, h);
	
	if (header.pf.flags & DDPF_RGB) 
	{
		readLinearImage(img);
	}
	else if (header.pf.flags & DDPF_FOURCC)
	{
		readBlockImage(img);
	}
}